

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O2

int32_t uloc_getDisplayScript_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UErrorCode err;
  UErrorCode local_34;
  
  local_34 = U_ZERO_ERROR;
  iVar1 = _getDisplayNameForComponent
                    (locale,displayLocale,dest,destCapacity,uloc_getScript_63,"Scripts%stand-alone",
                     &local_34);
  if (local_34 == U_USING_DEFAULT_WARNING) {
    iVar1 = _getDisplayNameForComponent
                      (locale,displayLocale,dest,destCapacity,uloc_getScript_63,"Scripts",pErrorCode
                      );
  }
  else {
    *pErrorCode = local_34;
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayScript(const char* locale,
                      const char* displayLocale,
                      UChar *dest, int32_t destCapacity,
                      UErrorCode *pErrorCode)
{
	UErrorCode err = U_ZERO_ERROR;
	int32_t res = _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                uloc_getScript, _kScriptsStandAlone, &err);
	
	if ( err == U_USING_DEFAULT_WARNING ) {
        return _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                    uloc_getScript, _kScripts, pErrorCode);
	} else {
		*pErrorCode = err;
		return res;
	}
}